

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::ExtraInitTypes_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,Descriptor *msg_des)

{
  bool bVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  allocator<char> local_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Descriptor *local_20;
  Descriptor *msg_des_local;
  PyiGenerator *this_local;
  
  local_20 = msg_des;
  msg_des_local = (Descriptor *)this;
  this_local = (PyiGenerator *)__return_storage_ptr__;
  local_30 = Descriptor::full_name(msg_des);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"google.protobuf.Timestamp");
  bVar1 = std::operator==(local_30,local_40);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"datetime.datetime, ",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    local_68 = Descriptor::full_name(local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"google.protobuf.Duration");
    bVar1 = std::operator==(local_68,local_78);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"datetime.timedelta, ",&local_79);
      std::allocator<char>::~allocator(&local_79);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,anon_var_dwarf_37cdd0 + 5,&local_7a);
      std::allocator<char>::~allocator(&local_7a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::ExtraInitTypes(const Descriptor& msg_des) const {
  if (msg_des.full_name() == "google.protobuf.Timestamp") {
    return "datetime.datetime, ";
  } else if (msg_des.full_name() == "google.protobuf.Duration") {
    return "datetime.timedelta, ";
  } else {
    return "";
  }
}